

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O3

tc_uECC_word_t
regularize_k(tc_uECC_word_t *k,tc_uECC_word_t *k0,tc_uECC_word_t *k1,tc_uECC_Curve curve)

{
  uint uVar1;
  ulong uVar2;
  char cVar3;
  uint uVar4;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar5;
  
  uVar6 = (uint)curve->num_n_bits;
  iVar5 = uVar6 + 0x3e;
  if (-1 < (int)(uVar6 + 0x1f)) {
    iVar5 = uVar6 + 0x1f;
  }
  uVar4 = iVar5 >> 5;
  cVar3 = (char)uVar4;
  if ('\0' < cVar3) {
    uVar2 = 0;
    uVar7 = 0;
    do {
      uVar1 = k[uVar2];
      uVar8 = uVar1 + uVar7 + curve->n[uVar2];
      if (uVar8 != uVar1) {
        uVar7 = 0;
      }
      uVar7 = uVar7 | uVar8 < uVar1;
      k0[uVar2] = uVar8;
      uVar2 = uVar2 + 1;
    } while ((uVar4 & 0x7f) != uVar2);
    uVar1 = 1;
    if (uVar7 != 0) goto LAB_0011c36f;
  }
  uVar1 = 0;
  if ((int)uVar6 < cVar3 * 0x20) {
    uVar1 = (uint)((k0[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0);
  }
LAB_0011c36f:
  if ('\0' < cVar3) {
    uVar2 = 0;
    uVar6 = 0;
    do {
      uVar7 = k0[uVar2];
      uVar8 = uVar7 + uVar6 + curve->n[uVar2];
      if (uVar8 != uVar7) {
        uVar6 = 0;
      }
      uVar6 = uVar6 | uVar8 < uVar7;
      k1[uVar2] = uVar8;
      uVar2 = uVar2 + 1;
    } while ((uVar4 & 0x7f) != uVar2);
  }
  return uVar1;
}

Assistant:

tc_uECC_word_t regularize_k(const tc_uECC_word_t * const k, tc_uECC_word_t *k0,
			 tc_uECC_word_t *k1, tc_uECC_Curve curve)
{

	wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);

	bitcount_t num_n_bits = curve->num_n_bits;

	tc_uECC_word_t carry = tc_uECC_vli_add(k0, k, curve->n, num_n_words) ||
			     (num_n_bits < ((bitcount_t)num_n_words * tc_uECC_WORD_SIZE * 8) &&
			     tc_uECC_vli_testBit(k0, num_n_bits));

	tc_uECC_vli_add(k1, k0, curve->n, num_n_words);

	return carry;
}